

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::anon_unknown_160::CompositePayloadRec
               (uint32_t depth,AssetResolutionResolver *resolver,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_search_paths,Layer *in_layer,PrimSpec *primspec,string *warn,string *err,
               PayloadCompositionOptions *options)

{
  bool bVar1;
  ostream *poVar2;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *this;
  reference primspec_00;
  string *psVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  PrimMeta *pPVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *this_00;
  reference pPVar7;
  ulong uVar8;
  string *psVar9;
  string local_40b8 [39];
  allocator local_4091;
  string local_4090 [32];
  fmt local_4070 [32];
  ostringstream local_4050 [8];
  ostringstream ss_e_10;
  string local_3ed8 [39];
  allocator local_3eb1;
  string local_3eb0 [32];
  fmt local_3e90 [32];
  ostringstream local_3e70 [8];
  ostringstream ss_e_9;
  string local_3cf8 [32];
  string local_3cd8;
  allocator local_3cb1;
  string local_3cb0 [32];
  fmt local_3c90 [32];
  ostringstream local_3c70 [8];
  ostringstream ss_e_8;
  PrimSpec *local_3af8;
  PrimSpec *src_ps_1;
  Layer layer_1;
  string asset_path_1;
  Payload *pl_1;
  const_iterator __end9;
  const_iterator __begin9;
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *__range9;
  ostringstream local_2498 [8];
  ostringstream ss_e_7;
  string local_2320 [32];
  ostringstream local_2300 [8];
  ostringstream ss_e_6;
  string local_2188 [32];
  ostringstream local_2168 [8];
  ostringstream ss_e_5;
  string local_1ff0 [32];
  ostringstream local_1fd0 [8];
  ostringstream ss_e_4;
  string local_1e58 [39];
  allocator local_1e31;
  string local_1e30 [32];
  fmt local_1e10 [32];
  ostringstream local_1df0 [8];
  ostringstream ss_e_3;
  string local_1c78 [39];
  allocator local_1c51;
  string local_1c50 [32];
  fmt local_1c30 [32];
  ostringstream local_1c10 [8];
  ostringstream ss_e_2;
  string local_1a98 [32];
  string local_1a78;
  allocator local_1a51;
  string local_1a50 [32];
  fmt local_1a30 [32];
  ostringstream local_1a10 [8];
  ostringstream ss_e_1;
  int local_1894;
  PrimSpec *local_1890;
  PrimSpec *src_ps;
  Layer layer;
  string asset_path;
  Payload *pl;
  const_iterator __end4;
  const_iterator __begin4;
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *__range4;
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *payloads;
  ListEditQual *qual;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  string cwp;
  PrimSpec *child;
  iterator __end2;
  iterator __begin2;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *__range2;
  ostringstream local_1c8 [8];
  ostringstream ss_e;
  string *warn_local;
  PrimSpec *primspec_local;
  Layer *in_layer_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *asset_search_paths_local;
  AssetResolutionResolver *resolver_local;
  uint32_t depth_local;
  
  if (options->max_depth < depth) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar2 = ::std::operator<<((ostream *)local_1c8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"CompositePayloadRec");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x30c);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1c8,"Too deep.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&__range2);
      ::std::__cxx11::string::~string((string *)&__range2);
    }
    resolver_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
    goto LAB_00219a9b;
  }
  this = PrimSpec::children(primspec);
  __end2._M_current =
       (PrimSpec *)std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::begin(this)
  ;
  child = (PrimSpec *)
          std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                                     *)&child), bVar1) {
    primspec_00 = __gnu_cxx::
                  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                  ::operator*(&__end2);
    bVar1 = CompositePayloadRec(depth + 1,resolver,asset_search_paths,in_layer,primspec_00,warn,err,
                                options);
    if (!bVar1) {
      resolver_local._7_1_ = 0;
      goto LAB_00219a9b;
    }
    __gnu_cxx::
    __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
    ::operator++(&__end2);
  }
  psVar3 = PrimSpec::get_current_working_path_abi_cxx11_(primspec);
  ::std::__cxx11::string::string
            ((string *)
             &search_paths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar3);
  __x = PrimSpec::get_asset_search_paths_abi_cxx11_(primspec);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&qual,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)__x);
  pPVar4 = PrimSpec::metas(primspec);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPVar4->payload);
  if (bVar1) {
    pPVar4 = PrimSpec::metas(primspec);
    pvVar5 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
             ::value(&pPVar4->payload);
    pPVar4 = PrimSpec::metas(primspec);
    pvVar6 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
             ::value(&pPVar4->payload);
    this_00 = &pvVar6->second;
    if ((pvVar5->first == ResetToExplicit) || (pvVar5->first == Prepend)) {
      __end4._M_current =
           (Payload *)
           std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::begin(this_00);
      pl = (Payload *)
           std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_tinyusdz::Payload_*,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>
                                         *)&pl), bVar1) {
        pPVar7 = __gnu_cxx::
                 __normal_iterator<const_tinyusdz::Payload_*,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>
                 ::operator*(&__end4);
        psVar3 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_(&pPVar7->asset_path);
        ::std::__cxx11::string::string((string *)&layer._asset_resolution_userdata,(string *)psVar3)
        ;
        Layer::Layer((Layer *)&src_ps);
        local_1890 = (PrimSpec *)0x0;
        tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_(&pPVar7->asset_path);
        uVar8 = ::std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          bVar1 = LoadAsset(resolver,(string *)
                                     &search_paths.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&qual,&options->fileformats,&pPVar7->asset_path,&pPVar7->prim_path,
                            (Layer *)&src_ps,&local_1890,true,
                            (bool)(options->error_when_asset_not_found & 1),
                            (bool)(options->error_when_unsupported_fileformat & 1),warn,err);
          if (bVar1) {
LAB_00218cd2:
            if (local_1890 == (PrimSpec *)0x0) {
              local_1894 = 7;
            }
            else {
              bVar1 = InheritPrimSpec(primspec,local_1890,warn,err);
              if (bVar1) {
                PrimSpec::typeName_abi_cxx11_(primspec);
                uVar8 = ::std::__cxx11::string::empty();
                if ((uVar8 & 1) == 0) {
                  psVar3 = PrimSpec::typeName_abi_cxx11_(primspec);
                  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)psVar3,"Model");
                  if (bVar1) goto LAB_00218e92;
                }
                else {
LAB_00218e92:
                  PrimSpec::typeName_abi_cxx11_(local_1890);
                  uVar8 = ::std::__cxx11::string::empty();
                  if ((uVar8 & 1) == 0) {
                    psVar3 = PrimSpec::typeName_abi_cxx11_(local_1890);
                    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)psVar3,"Model");
                    if (!bVar1) {
                      psVar3 = PrimSpec::typeName_abi_cxx11_(local_1890);
                      psVar9 = PrimSpec::typeName_abi_cxx11_(primspec);
                      ::std::__cxx11::string::operator=((string *)psVar9,(string *)psVar3);
                    }
                  }
                }
                local_1894 = 0;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1df0);
                poVar2 = ::std::operator<<((ostream *)local_1df0,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"CompositePayloadRec");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x349);
                ::std::operator<<(poVar2," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1e30,"Failed to reference layer `{}`",&local_1e31);
                fmt::format<std::__cxx11::string>
                          (local_1e10,(string *)local_1e30,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &layer._asset_resolution_userdata);
                poVar2 = ::std::operator<<((ostream *)local_1df0,(string *)local_1e10);
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::string::~string((string *)local_1e10);
                ::std::__cxx11::string::~string(local_1e30);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1e31);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_1e58);
                  ::std::__cxx11::string::~string(local_1e58);
                }
                resolver_local._7_1_ = 0;
                local_1894 = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_1df0);
              }
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1c10);
            poVar2 = ::std::operator<<((ostream *)local_1c10,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"CompositePayloadRec");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x33d);
            ::std::operator<<(poVar2," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1c50,"Failed to `references` asset `{}`",&local_1c51);
            psVar3 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_(&pPVar7->asset_path);
            fmt::format<std::__cxx11::string>
                      (local_1c30,(string *)local_1c50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
            poVar2 = ::std::operator<<((ostream *)local_1c10,(string *)local_1c30);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::~string((string *)local_1c30);
            ::std::__cxx11::string::~string(local_1c50);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1c51);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_1c78);
              ::std::__cxx11::string::~string(local_1c78);
            }
            resolver_local._7_1_ = 0;
            local_1894 = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1c10);
          }
        }
        else {
          bVar1 = Path::is_absolute_path(&pPVar7->prim_path);
          if (bVar1) {
            bVar1 = Layer::find_primspec_at(in_layer,&pPVar7->prim_path,&local_1890,err);
            if (bVar1) goto LAB_00218cd2;
            resolver_local._7_1_ = 0;
            local_1894 = 1;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1a10);
            poVar2 = ::std::operator<<((ostream *)local_1a10,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"CompositePayloadRec");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x333);
            ::std::operator<<(poVar2," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1a50,"primPath is not absolute path: {}",&local_1a51);
            Path::full_path_name_abi_cxx11_(&local_1a78,&pPVar7->prim_path);
            fmt::format<std::__cxx11::string>
                      (local_1a30,(string *)local_1a50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1a78);
            poVar2 = ::std::operator<<((ostream *)local_1a10,(string *)local_1a30);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::~string((string *)local_1a30);
            ::std::__cxx11::string::~string((string *)&local_1a78);
            ::std::__cxx11::string::~string(local_1a50);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1a51);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_1a98);
              ::std::__cxx11::string::~string(local_1a98);
            }
            resolver_local._7_1_ = 0;
            local_1894 = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1a10);
          }
        }
        Layer::~Layer((Layer *)&src_ps);
        ::std::__cxx11::string::~string((string *)&layer._asset_resolution_userdata);
        if ((local_1894 != 0) && (local_1894 != 7)) goto LAB_00219a83;
        __gnu_cxx::
        __normal_iterator<const_tinyusdz::Payload_*,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>
        ::operator++(&__end4);
      }
      goto LAB_00219a5d;
    }
    if (pvVar5->first == Delete) {
      ::std::__cxx11::ostringstream::ostringstream(local_1fd0);
      poVar2 = ::std::operator<<((ostream *)local_1fd0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"CompositePayloadRec");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x359);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1fd0,"`delete` references are not supported yet.")
      ;
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_1ff0);
        ::std::__cxx11::string::~string(local_1ff0);
      }
      resolver_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1fd0);
    }
    else if (pvVar5->first == Add) {
      ::std::__cxx11::ostringstream::ostringstream(local_2168);
      poVar2 = ::std::operator<<((ostream *)local_2168,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"CompositePayloadRec");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x35b);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_2168,"`add` references are not supported yet.");
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_2188);
        ::std::__cxx11::string::~string(local_2188);
      }
      resolver_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_2168);
    }
    else if (pvVar5->first == Order) {
      ::std::__cxx11::ostringstream::ostringstream(local_2300);
      poVar2 = ::std::operator<<((ostream *)local_2300,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"CompositePayloadRec");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x35d);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_2300,"`order` references are not supported yet.");
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_2320);
        ::std::__cxx11::string::~string(local_2320);
      }
      resolver_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_2300);
    }
    else {
      if (pvVar5->first != Invalid) {
        if (pvVar5->first == Append) {
          __end9._M_current =
               (Payload *)
               std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::begin(this_00);
          pl_1 = (Payload *)
                 std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::end(this_00);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end9,(__normal_iterator<const_tinyusdz::Payload_*,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>
                                             *)&pl_1), bVar1) {
            pPVar7 = __gnu_cxx::
                     __normal_iterator<const_tinyusdz::Payload_*,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>
                     ::operator*(&__end9);
            psVar3 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_(&pPVar7->asset_path);
            ::std::__cxx11::string::string
                      ((string *)&layer_1._asset_resolution_userdata,(string *)psVar3);
            Layer::Layer((Layer *)&src_ps_1);
            local_3af8 = (PrimSpec *)0x0;
            tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_(&pPVar7->asset_path);
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              bVar1 = LoadAsset(resolver,(string *)
                                         &search_paths.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&qual,&options->fileformats,&pPVar7->asset_path,
                                &pPVar7->prim_path,(Layer *)&src_ps_1,&local_3af8,true,
                                (bool)(options->error_when_asset_not_found & 1),
                                (bool)(options->error_when_unsupported_fileformat & 1),warn,err);
              if (bVar1) {
LAB_002197d3:
                if (local_3af8 == (PrimSpec *)0x0) {
                  local_1894 = 0x17;
                }
                else {
                  bVar1 = OverridePrimSpec(primspec,local_3af8,warn,err);
                  if (bVar1) {
                    PrimSpec::typeName_abi_cxx11_(primspec);
                    uVar8 = ::std::__cxx11::string::empty();
                    if ((uVar8 & 1) == 0) {
                      psVar3 = PrimSpec::typeName_abi_cxx11_(primspec);
                      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)psVar3,"Model");
                      if (bVar1) goto LAB_00219993;
                    }
                    else {
LAB_00219993:
                      PrimSpec::typeName_abi_cxx11_(local_3af8);
                      uVar8 = ::std::__cxx11::string::empty();
                      if ((uVar8 & 1) == 0) {
                        psVar3 = PrimSpec::typeName_abi_cxx11_(local_3af8);
                        bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar3,"Model");
                        if (!bVar1) {
                          psVar3 = PrimSpec::typeName_abi_cxx11_(local_3af8);
                          psVar9 = PrimSpec::typeName_abi_cxx11_(primspec);
                          ::std::__cxx11::string::operator=((string *)psVar9,(string *)psVar3);
                        }
                      }
                    }
                    local_1894 = 0;
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_4050);
                    poVar2 = ::std::operator<<((ostream *)local_4050,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"CompositePayloadRec");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x388);
                    ::std::operator<<(poVar2," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_4090,"Failed to reference layer `{}`",&local_4091);
                    fmt::format<std::__cxx11::string>
                              (local_4070,(string *)local_4090,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &layer_1._asset_resolution_userdata);
                    poVar2 = ::std::operator<<((ostream *)local_4050,(string *)local_4070);
                    ::std::operator<<(poVar2,"\n");
                    ::std::__cxx11::string::~string((string *)local_4070);
                    ::std::__cxx11::string::~string(local_4090);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_4091);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::__cxx11::string::operator+=((string *)err,local_40b8);
                      ::std::__cxx11::string::~string(local_40b8);
                    }
                    resolver_local._7_1_ = 0;
                    local_1894 = 1;
                    ::std::__cxx11::ostringstream::~ostringstream(local_4050);
                  }
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_3e70);
                poVar2 = ::std::operator<<((ostream *)local_3e70,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"CompositePayloadRec");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x37c);
                ::std::operator<<(poVar2," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_3eb0,"Failed to `references` asset `{}`",&local_3eb1);
                psVar3 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_(&pPVar7->asset_path);
                fmt::format<std::__cxx11::string>
                          (local_3e90,(string *)local_3eb0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar3);
                poVar2 = ::std::operator<<((ostream *)local_3e70,(string *)local_3e90);
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::string::~string((string *)local_3e90);
                ::std::__cxx11::string::~string(local_3eb0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_3eb1);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_3ed8);
                  ::std::__cxx11::string::~string(local_3ed8);
                }
                resolver_local._7_1_ = 0;
                local_1894 = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_3e70);
              }
            }
            else {
              bVar1 = Path::is_absolute_path(&pPVar7->prim_path);
              if (bVar1) {
                bVar1 = Layer::find_primspec_at(in_layer,&pPVar7->prim_path,&local_3af8,err);
                if (bVar1) goto LAB_002197d3;
                resolver_local._7_1_ = 0;
                local_1894 = 1;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_3c70);
                poVar2 = ::std::operator<<((ostream *)local_3c70,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"CompositePayloadRec");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x372);
                ::std::operator<<(poVar2," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_3cb0,"primPath is not absolute path: {}",&local_3cb1);
                Path::full_path_name_abi_cxx11_(&local_3cd8,&pPVar7->prim_path);
                fmt::format<std::__cxx11::string>
                          (local_3c90,(string *)local_3cb0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_3cd8);
                poVar2 = ::std::operator<<((ostream *)local_3c70,(string *)local_3c90);
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::string::~string((string *)local_3c90);
                ::std::__cxx11::string::~string((string *)&local_3cd8);
                ::std::__cxx11::string::~string(local_3cb0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_3cb1);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_3cf8);
                  ::std::__cxx11::string::~string(local_3cf8);
                }
                resolver_local._7_1_ = 0;
                local_1894 = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_3c70);
              }
            }
            Layer::~Layer((Layer *)&src_ps_1);
            ::std::__cxx11::string::~string((string *)&layer_1._asset_resolution_userdata);
            if ((local_1894 != 0) && (local_1894 != 0x17)) goto LAB_00219a83;
            __gnu_cxx::
            __normal_iterator<const_tinyusdz::Payload_*,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>
            ::operator++(&__end9);
          }
        }
        goto LAB_00219a5d;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_2498);
      poVar2 = ::std::operator<<((ostream *)local_2498,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"CompositePayloadRec");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x35f);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_2498,
                                 "Invalid listedit qualifier to for `references`.");
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,(string *)&__range9);
        ::std::__cxx11::string::~string((string *)&__range9);
      }
      resolver_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_2498);
    }
  }
  else {
LAB_00219a5d:
    pPVar4 = PrimSpec::metas(primspec);
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
    ::reset(&pPVar4->payload);
    resolver_local._7_1_ = 1;
  }
LAB_00219a83:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&qual);
  ::std::__cxx11::string::~string
            ((string *)
             &search_paths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00219a9b:
  return (bool)(resolver_local._7_1_ & 1);
}

Assistant:

bool CompositePayloadRec(uint32_t depth, AssetResolutionResolver &resolver,
                         const std::vector<std::string> &asset_search_paths,
                         const Layer &in_layer,
                         PrimSpec &primspec /* [inout] */, std::string *warn,
                         std::string *err,
                         const PayloadCompositionOptions &options) {
  if (depth > options.max_depth) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositePayloadRec(depth + 1, resolver, asset_search_paths, in_layer, child,
                             warn, err, options)) {
      return false;
    }
  }

  // Use PrimSpec's AssetResolution state.
  std::string cwp = primspec.get_current_working_path();
  std::vector<std::string> search_paths = primspec.get_asset_search_paths();

  if (primspec.metas().payload) {
    const ListEditQual &qual = primspec.metas().payload.value().first;
    const auto &payloads = primspec.metas().payload.value().second;

    if ((qual == ListEditQual::ResetToExplicit) ||
        (qual == ListEditQual::Prepend)) {
      for (const auto &pl : payloads) {
        std::string asset_path = pl.asset_path.GetAssetPath();
        DCOUT("asset_path = " << asset_path);

        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (pl.asset_path.GetAssetPath().empty()) {
          if (pl.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(pl.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("primPath is not absolute path: {}",
                            pl.prim_path.full_path_name()));
          }
        } else {

          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         pl.asset_path, pl.prim_path, &layer, &src_ps,
                         /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(fmt::format("Failed to `references` asset `{}`",
                                              pl.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `inherits` op
        if (!InheritPrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("Failed to reference layer `{}`", asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }

        DCOUT("inherit done: primspec = " << primspec.name());
      }

    } else if (qual == ListEditQual::Delete) {
      PUSH_ERROR_AND_RETURN("`delete` references are not supported yet.");
    } else if (qual == ListEditQual::Add) {
      PUSH_ERROR_AND_RETURN("`add` references are not supported yet.");
    } else if (qual == ListEditQual::Order) {
      PUSH_ERROR_AND_RETURN("`order` references are not supported yet.");
    } else if (qual == ListEditQual::Invalid) {
      PUSH_ERROR_AND_RETURN("Invalid listedit qualifier to for `references`.");
    } else if (qual == ListEditQual::Append) {
      for (const auto &pl : payloads) {
        std::string asset_path = pl.asset_path.GetAssetPath();

        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (pl.asset_path.GetAssetPath().empty()) {
          if (pl.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(pl.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("primPath is not absolute path: {}",
                            pl.prim_path.full_path_name()));
          }
        } else {

          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         pl.asset_path, pl.prim_path, &layer, &src_ps,
                         /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(fmt::format("Failed to `references` asset `{}`",
                                              pl.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `over` op
        if (!OverridePrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("Failed to reference layer `{}`", asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }
      }
    }

  }

  // Remove `payload`.
  primspec.metas().payload.reset();

  return true;
}